

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void __thiscall
json11::anon_unknown_21::JsonParser::encode_utf8(JsonParser *this,long pt,string *out)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  string *out_local;
  long pt_local;
  JsonParser *this_local;
  
  if (-1 < pt) {
    bVar3 = (byte)pt;
    if (pt < 0x80) {
      std::__cxx11::string::operator+=((string *)out,bVar3);
    }
    else {
      bVar1 = (byte)(pt >> 6);
      if (pt < 0x800) {
        std::__cxx11::string::operator+=((string *)out,bVar1 | 0xc0);
        std::__cxx11::string::operator+=((string *)out,bVar3 & 0x3f | 0x80);
      }
      else {
        bVar2 = (byte)(pt >> 0xc);
        if (pt < 0x10000) {
          std::__cxx11::string::operator+=((string *)out,bVar2 | 0xe0);
          std::__cxx11::string::operator+=((string *)out,bVar1 & 0x3f | 0x80);
          std::__cxx11::string::operator+=((string *)out,bVar3 & 0x3f | 0x80);
        }
        else {
          std::__cxx11::string::operator+=((string *)out,(byte)(pt >> 0x12) | 0xf0);
          std::__cxx11::string::operator+=((string *)out,bVar2 & 0x3f | 0x80);
          std::__cxx11::string::operator+=((string *)out,bVar1 & 0x3f | 0x80);
          std::__cxx11::string::operator+=((string *)out,bVar3 & 0x3f | 0x80);
        }
      }
    }
  }
  return;
}

Assistant:

void encode_utf8(long pt, string & out) {
        if (pt < 0)
            return;

        if (pt < 0x80) {
            out += static_cast<char>(pt);
        } else if (pt < 0x800) {
            out += static_cast<char>((pt >> 6) | 0xC0);
            out += static_cast<char>((pt & 0x3F) | 0x80);
        } else if (pt < 0x10000) {
            out += static_cast<char>((pt >> 12) | 0xE0);
            out += static_cast<char>(((pt >> 6) & 0x3F) | 0x80);
            out += static_cast<char>((pt & 0x3F) | 0x80);
        } else {
            out += static_cast<char>((pt >> 18) | 0xF0);
            out += static_cast<char>(((pt >> 12) & 0x3F) | 0x80);
            out += static_cast<char>(((pt >> 6) & 0x3F) | 0x80);
            out += static_cast<char>((pt & 0x3F) | 0x80);
        }
    }